

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

string_view __thiscall slang::parsing::Token::valueText(Token *this)

{
  size_t sVar1;
  string_view sVar2;
  
  if (this->kind == Identifier) {
    sVar2 = rawText(this);
    sVar1 = sVar2._M_len;
    if ((sVar1 != 0) && (*sVar2._M_str == '\\')) {
      sVar2._M_str = (char *)((long)sVar2._M_str + 1);
      sVar2._M_len = (size_t)(sVar1 - 1);
    }
  }
  else if (this->kind == StringLiteral) {
    sVar2 = *(string_view *)(this->info + 1);
  }
  else {
    sVar2 = rawText(this);
  }
  return sVar2;
}

Assistant:

std::string_view Token::valueText() const {
    switch (kind) {
        case TokenKind::StringLiteral:
            return info->stringText();
        case TokenKind::Identifier: {
            std::string_view result = rawText();
            if (!result.empty() && result[0] == '\\')
                result = result.substr(1);
            return result;
        }
        default:
            return rawText();
    }
}